

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

Maybe<capnp::Schema> __thiscall
capnp::compiler::Compiler::Node::resolveBootstrapSchema(Node *this,uint64_t id,Reader brand)

{
  iterator iVar1;
  Schema SVar2;
  _func_int **in_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX;
  Maybe<capnp::Schema> MVar4;
  Fault f;
  char local_30;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 aVar3;
  
  _local_30 = in_RDX;
  iVar1 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(**(long **)(id + 8) + 0x1b0),(key_type_conflict *)&stack0xffffffffffffffd0);
  if ((iVar1.
       super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_false>
       ._M_cur != (__node_type *)0x0) &&
     (*(long *)((long)iVar1.
                      super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_false>
                      ._M_cur + 0x10) != 0)) {
    MVar4 = getBootstrapSchema((Node *)&stack0xffffffffffffffd0);
    aVar3 = MVar4.ptr.field_1;
    if (local_30 == '\x01') {
      SVar2 = SchemaLoader::get((SchemaLoader *)(**(long **)(id + 8) + 0x188),(uint64_t)in_RDX,brand
                                ,(Schema)0x6d3cd8);
      this->module = (CompiledModule *)SVar2.raw;
      aVar3 = extraout_RDX;
    }
    *(bool *)&(this->super_Resolver)._vptr_Resolver = local_30 == '\x01';
    MVar4.ptr.field_1 = aVar3;
    MVar4.ptr._0_8_ = this;
    return (Maybe<capnp::Schema>)MVar4.ptr;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
            ((Fault *)&stack0xffffffffffffffd0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++"
             ,0x3ba,FAILED,(char *)0x0,"\"Tried to get schema for ID we haven\'t seen before.\"",
             (char (*) [51])"Tried to get schema for ID we haven\'t seen before.");
  kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffffd0);
}

Assistant:

kj::Maybe<Schema> Compiler::Node::resolveBootstrapSchema(
    uint64_t id, schema::Brand::Reader brand) {
  KJ_IF_SOME(node, module->getCompiler().findNode(id)) {
    // Make sure the bootstrap schema is loaded into the SchemaLoader.
    if (node.getBootstrapSchema() == kj::none) {
      return kj::none;
    }

    // Now we actually invoke get() to evaluate the brand.
    return module->getCompiler().getWorkspace().bootstrapLoader.get(id, brand);
  } else {
    KJ_FAIL_REQUIRE("Tried to get schema for ID we haven't seen before.");
  }
}